

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_integer_sequence.cpp
# Opt level: O1

uint get_ise_sequence_bitcount(uint character_count,quant_method quant_level)

{
  uint uVar1;
  
  uVar1 = 0x400;
  if (quant_level < (QUANT_256|QUANT_3)) {
    uVar1 = (byte)ise_sizes._M_elems[quant_level] >> 5 | 1;
    uVar1 = ((((byte)ise_sizes._M_elems[quant_level] & 0x3f) * character_count + uVar1) - 1) / uVar1
    ;
  }
  return uVar1;
}

Assistant:

unsigned int get_ise_sequence_bitcount(
	unsigned int character_count,
	quant_method quant_level
) {
	// Cope with out-of bounds values - input might be invalid
	if (static_cast<size_t>(quant_level) >= ise_sizes.size())
	{
		// Arbitrary large number that's more than an ASTC block can hold
		return 1024;
	}

	auto& entry = ise_sizes[quant_level];
	unsigned int divisor = (entry.divisor << 1) + 1;
	return (entry.scale * character_count + divisor - 1) / divisor;
}